

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_SubDEdgeChainHistoryValue::ReportHelper(ON_SubDEdgeChainHistoryValue *this,ON_TextLog *text_log)

{
  ON_SubDEdgeChain *this_00;
  long lVar1;
  long lVar2;
  
  ON_TextLog::Print(text_log,"SubD edge chain value\n");
  ON_TextLog::PushIndent(text_log);
  lVar2 = (long)(this->m_value).m_count;
  if (0 < lVar2) {
    lVar1 = 0;
    do {
      this_00 = (this->m_value).m_a[lVar1];
      if (this_00 != (ON_SubDEdgeChain *)0x0) {
        ON_SubDEdgeChain::Dump(this_00,text_log);
      }
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_SubDEdgeChainHistoryValue::ReportHelper(ON_TextLog& text_log) const
{
  text_log.Print("SubD edge chain value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for (i = 0; i < count; i++)
  {
    if( nullptr != m_value[i])
      m_value[i]->Dump(text_log);
  }
  text_log.PopIndent();
  return true;
}